

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void do_storms(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int dy;
  bool bVar6;
  
  if (((level->flags).field_0xa & 4) != 0) {
    uVar1 = mt_random();
    if ((uVar1 & 7) == 0) {
      uVar1 = mt_random();
      uVar1 = (uVar1 & 0x3f) + 1;
      do {
        iVar5 = 100;
        do {
          uVar2 = mt_random();
          uVar3 = mt_random();
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) goto LAB_0025ce45;
          uVar2 = uVar2 % 0x4f + 1;
        } while (level->locations[uVar2][uVar3 % 0x15].typ != '&');
        uVar4 = mt_random();
        iVar5 = ~((uVar4 / 3) * 3) + uVar4;
        uVar4 = mt_random();
        dy = ~((uVar4 / 3) * 3) + uVar4;
        if (iVar5 != 0 || dy != 0) {
          buzz(-0xf,8,(xchar)uVar2,(xchar)(uVar3 % 0x15),iVar5,dy);
        }
LAB_0025ce45:
        bVar6 = uVar1 < 0x21;
        uVar1 = uVar1 * 2;
      } while (bVar6);
      if (level->locations[u.ux][u.uy].typ != '&') {
        You_hear("a rumbling noise.");
        return;
      }
      pline("Kaboom!!!  Boom!!  Boom!!");
      if ((u._1052_1_ & 0x10) == 0) {
        stop_occupation();
        nomul(-3,"hiding from a thunderstorm");
        return;
      }
    }
  }
  return;
}

Assistant:

void do_storms(void)
{
    int nstrike;
    int x, y;
    int dirx, diry;
    int count;

    /* no lightning if not stormy level or too often, even then */
    if (!level->flags.stormy || rn2(8))
	return;

    /* the number of strikes is 8-log2(nstrike) */
    for (nstrike = rnd(64); nstrike <= 64; nstrike *= 2) {
	count = 0;
	do {
	    x = rnd(COLNO-1);
	    y = rn2(ROWNO);
	} while (++count < 100 && level->locations[x][y].typ != CLOUD);

	if (count < 100) {
	    dirx = rn2(3) - 1;
	    diry = rn2(3) - 1;
	    if (dirx != 0 || diry != 0)
		buzz(-15, /* "monster" LIGHTNING spell */
		     8, x, y, dirx, diry);
	}
    }

    if (level->locations[u.ux][u.uy].typ == CLOUD) {
	/* inside a cloud during a thunder storm is deafening */
	pline("Kaboom!!!  Boom!!  Boom!!");
	if (!u.uinvulnerable) {
	    stop_occupation();
	    nomul(-3, "hiding from a thunderstorm");
	}
    } else
	You_hear("a rumbling noise.");
}